

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall slang::driver::Driver::printError(Driver *this,string *message)

{
  string_view text;
  string_view text_00;
  color_type cVar1;
  string_view text_01;
  size_t in_stack_ffffffffffffffd8;
  
  cVar1 = (color_type)
          ((ulong)(byte)(((this->textDiagClient).
                          super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_DiagnosticClient).field_0x1b << 0x20);
  text_01._M_str = "error: ";
  text_01._M_len = 7;
  OS::printE((text_style *)&stack0xffffffffffffffe0,text_01);
  text._M_str = (char *)cVar1;
  text._M_len = in_stack_ffffffffffffffd8;
  OS::printE(text);
  text_00._M_str = (char *)cVar1;
  text_00._M_len = in_stack_ffffffffffffffd8;
  OS::printE(text_00);
  return;
}

Assistant:

void Driver::printError(const std::string& message) {
    OS::printE(fg(textDiagClient->errorColor), "error: ");
    OS::printE(message);
    OS::printE("\n");
}